

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

uint64_t __thiscall
basisu::etc_block::evaluate_etc1_error
          (etc_block *this,color_rgba *pBlock_pixels,bool perceptual,int subblock_index)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  uint64_t uVar4;
  color_rgba unpacked_block [16];
  color_rgba local_68 [16];
  
  unpack_etc1(this,local_68,false);
  if (subblock_index < 0) {
    uVar4 = 0;
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 4) {
      uVar2 = color_distance(perceptual,(color_rgba *)((long)&pBlock_pixels->field_0 + lVar3),
                             (color_rgba *)((long)&local_68[0].field_0 + lVar3),false);
      uVar4 = uVar4 + uVar2;
    }
  }
  else {
    bVar1 = (this->field_0).m_bytes[3];
    uVar4 = 0;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      uVar2 = color_distance(perceptual,
                             pBlock_pixels +
                             *(uint *)(g_etc1_pixel_indices +
                                      lVar3 * 4 +
                                      (ulong)(uint)subblock_index * 0x20 + (ulong)((bVar1 & 1) << 6)
                                      ),
                             local_68 +
                             *(uint *)(g_etc1_pixel_indices +
                                      lVar3 * 4 +
                                      (ulong)(uint)subblock_index * 0x20 + (ulong)((bVar1 & 1) << 6)
                                      ),false);
      uVar4 = uVar4 + uVar2;
    }
  }
  return uVar4;
}

Assistant:

uint64_t etc_block::evaluate_etc1_error(const color_rgba* pBlock_pixels, bool perceptual, int subblock_index) const
	{
		color_rgba unpacked_block[16];

		unpack_etc1(*this, unpacked_block);

		uint64_t total_error = 0;

		if (subblock_index < 0)
		{
			for (uint32_t i = 0; i < 16; i++)
				total_error += color_distance(perceptual, pBlock_pixels[i], unpacked_block[i], false);
		}
		else
		{
			const bool flip_bit = get_flip_bit();

			for (uint32_t i = 0; i < 8; i++)
			{
				const uint32_t idx = g_etc1_pixel_indices[flip_bit][subblock_index][i];

				total_error += color_distance(perceptual, pBlock_pixels[idx], unpacked_block[idx], false);
			}
		}

		return total_error;
	}